

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O2

void __thiscall
pstore::broker::bimap<int,_char,_std::less<int>,_std::less<char>_>::set
          (bimap<int,_char,_std::less<int>,_std::less<char>_> *this,int *left,char *right)

{
  _Rb_tree_iterator<std::pair<const_int,_char>_> _Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_char>_>,_bool> pVar2;
  _Base_ptr local_20;
  
  pVar2 = std::
          _Rb_tree<int,std::pair<int_const,char>,std::_Select1st<std::pair<int_const,char>>,std::less<int>,std::allocator<std::pair<int_const,char>>>
          ::_M_emplace_unique<int_const&,char_const&>
                    ((_Rb_tree<int,std::pair<int_const,char>,std::_Select1st<std::pair<int_const,char>>,std::less<int>,std::allocator<std::pair<int_const,char>>>
                      *)this,left,right);
  _Var1 = pVar2.first._M_node;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_20 = _Var1._M_node + 1;
    std::
    _Rb_tree<char,std::pair<char_const,int_const*>,std::_Select1st<std::pair<char_const,int_const*>>,std::less<char>,std::allocator<std::pair<char_const,int_const*>>>
    ::_M_emplace_unique<char&,int_const*>
              ((_Rb_tree<char,std::pair<char_const,int_const*>,std::_Select1st<std::pair<char_const,int_const*>>,std::less<char>,std::allocator<std::pair<char_const,int_const*>>>
                *)&this->right_,&_Var1._M_node[1].field_0x4,(int **)&local_20);
  }
  if ((this->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (this->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    _Var1._M_node[1].field_0x4 = *right;
    return;
  }
  assert_failed("left_.size () == right_.size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                ,0x86);
}

Assistant:

void bimap<L, R, Lcmp, Rcmp>::set (L const & left, R const & right) {
#ifdef PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN
            auto emplace_res = left_.insert_or_assign (left, right);
#else
            auto emplace_res = left_.emplace (left, right);
#endif // PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN

            auto & it = emplace_res.first;
            if (emplace_res.second) {
                // We inserted a new key-value pair. Update right_ to match.
                right_.emplace (it->second, &it->first);
            }
            PSTORE_ASSERT (left_.size () == right_.size ());

#ifndef PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN
            it->second = right;
#endif // PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN
        }